

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_internal.h
# Opt level: O2

void __thiscall
google::protobuf::internal::RepeatedFieldWrapper<unsigned_long>::Clear
          (RepeatedFieldWrapper<unsigned_long> *this,Field *data)

{
  RepeatedField<unsigned_long> *this_00;
  
  this_00 = (RepeatedField<unsigned_long> *)(**(code **)(*(long *)this + 0x88))();
  RepeatedField<unsigned_long>::Clear(this_00);
  return;
}

Assistant:

void Clear(Field* data) const override {
    MutableRepeatedField(data)->Clear();
  }